

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockAgent.h
# Opt level: O2

void __thiscall
jaegertracing::testutils::MockAgent::
addSamplingStrategy<char_const(&)[13],jaegertracing::sampling_manager::thrift::SamplingStrategyResponse&>
          (MockAgent *this,char (*args) [13],SamplingStrategyResponse *args_1)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,*args,&local_39);
  SamplingManager::addSamplingStrategy((SamplingManager *)(this + 0x168),&local_38,args_1);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void addSamplingStrategy(Args&&... args)
    {
        _samplingMgr.addSamplingStrategy(std::forward<Args>(args)...);
    }